

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filteredbrk.cpp
# Opt level: O0

int32_t __thiscall
icu_63::SimpleFilteredSentenceBreakIterator::internalNext
          (SimpleFilteredSentenceBreakIterator *this,int32_t n)

{
  UBool UVar1;
  EFBMatchResult EVar2;
  UText *ut;
  int64_t iVar3;
  BreakIterator *pBVar4;
  EFBMatchResult m;
  int64_t utextLen;
  UErrorCode status;
  int32_t n_local;
  SimpleFilteredSentenceBreakIterator *this_local;
  
  utextLen._4_4_ = n;
  if ((n == -1) ||
     (_status = this,
     UVar1 = LocalPointerBase<icu_63::UCharsTrie>::isNull
                       (&(this->fData->fBackwardsTrie).super_LocalPointerBase<icu_63::UCharsTrie>),
     UVar1 != '\0')) {
    this_local._4_4_ = utextLen._4_4_;
  }
  else {
    utextLen._0_4_ = U_ZERO_ERROR;
    resetState(this,(UErrorCode *)&utextLen);
    UVar1 = ::U_FAILURE((UErrorCode)utextLen);
    if (UVar1 == '\0') {
      ut = LocalPointerBase<UText>::getAlias(&(this->fText).super_LocalPointerBase<UText>);
      iVar3 = utext_nativeLength_63(ut);
      while (utextLen._4_4_ != -1 && utextLen._4_4_ != iVar3) {
        EVar2 = breakExceptionAt(this,utextLen._4_4_);
        if ((EVar2 == kNoExceptionHere) || (EVar2 != kExceptionHere)) {
          return utextLen._4_4_;
        }
        pBVar4 = LocalPointerBase<icu_63::BreakIterator>::operator->
                           (&(this->fDelegate).super_LocalPointerBase<icu_63::BreakIterator>);
        utextLen._4_4_ = (*(pBVar4->super_UObject)._vptr_UObject[0xd])();
      }
      this_local._4_4_ = utextLen._4_4_;
    }
    else {
      this_local._4_4_ = -1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int32_t
SimpleFilteredSentenceBreakIterator::internalNext(int32_t n) {
  if(n == UBRK_DONE || // at end  or
    fData->fBackwardsTrie.isNull()) { // .. no backwards table loaded == no exceptions
      return n;
  }
  // OK, do we need to break here?
  UErrorCode status = U_ZERO_ERROR;
  // refresh text
  resetState(status);
  if(U_FAILURE(status)) return UBRK_DONE; // bail out
  int64_t utextLen = utext_nativeLength(fText.getAlias());

  //if(debug2) u_printf("str, native len=%d\n", utext_nativeLength(fText.getAlias()));
  while (n != UBRK_DONE && n != utextLen) { // outer loop runs once per underlying break (from fDelegate).
    SimpleFilteredSentenceBreakIterator::EFBMatchResult m = breakExceptionAt(n);

    switch(m) {
    case kExceptionHere:
      n = fDelegate->next(); // skip this one. Find the next lowerlevel break.
      continue;

    default:
    case kNoExceptionHere:
      return n;
    }    
  }
  return n;
}